

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_hdlr(MovDemuxer *this,MOVAtom atom)

{
  uint uVar1;
  
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar1 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
  if (uVar1 == 0) {
    this->isom = 1;
  }
  IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  IOContextDemuxer::skip_bytes
            (&this->super_IOContextDemuxer,
             (atom.size - (this->super_IOContextDemuxer).m_processedBytes) + atom.offset);
  return 0;
}

Assistant:

int MovDemuxer::mov_read_hdlr(MOVAtom atom)
{
    get_byte();  // version
    get_be24();  // flags

    // component type
    const unsigned ctype = get_le32();
    if (!ctype)
        isom = 1;

    get_le32();  // component subtype
    get_be32();  // component  manufacture
    get_be32();  // component flags
    get_be32();  // component flags mask

    skip_bytes(atom.size - (m_processedBytes - atom.offset));
    return 0;
}